

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeSorterRewind(VdbeCursor *pCsr,int *pbEof)

{
  VdbeSorter *pSorter_00;
  int local_2c;
  int rc;
  VdbeSorter *pSorter;
  int *pbEof_local;
  VdbeCursor *pCsr_local;
  
  local_2c = 0;
  pSorter_00 = (pCsr->uc).pSorter;
  if (pSorter_00->bUsePMA == '\0') {
    if ((pSorter_00->list).pList == (SorterRecord *)0x0) {
      *pbEof = 1;
    }
    else {
      *pbEof = 0;
      local_2c = vdbeSorterSort(pSorter_00->aTask,&pSorter_00->list);
    }
    pCsr_local._4_4_ = local_2c;
  }
  else {
    local_2c = vdbeSorterFlushPMA(pSorter_00);
    if (local_2c == 0) {
      local_2c = vdbeSorterSetupMerge(pSorter_00);
      *pbEof = 0;
    }
    pCsr_local._4_4_ = local_2c;
  }
  return pCsr_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeSorterRewind(const VdbeCursor *pCsr, int *pbEof){
  VdbeSorter *pSorter;
  int rc = SQLITE_OK;             /* Return code */

  assert( pCsr->eCurType==CURTYPE_SORTER );
  pSorter = pCsr->uc.pSorter;
  assert( pSorter );

  /* If no data has been written to disk, then do not do so now. Instead,
  ** sort the VdbeSorter.pRecord list. The vdbe layer will read data directly
  ** from the in-memory list.  */
  if( pSorter->bUsePMA==0 ){
    if( pSorter->list.pList ){
      *pbEof = 0;
      rc = vdbeSorterSort(&pSorter->aTask[0], &pSorter->list);
    }else{
      *pbEof = 1;
    }
    return rc;
  }

  /* Write the current in-memory list to a PMA. When the VdbeSorterWrite() 
  ** function flushes the contents of memory to disk, it immediately always
  ** creates a new list consisting of a single key immediately afterwards.
  ** So the list is never empty at this point.  */
  assert( pSorter->list.pList );
  rc = vdbeSorterFlushPMA(pSorter);

  /* Join all threads */
  rc = vdbeSorterJoinAll(pSorter, rc);

  vdbeSorterRewindDebug("rewind");

  /* Assuming no errors have occurred, set up a merger structure to 
  ** incrementally read and merge all remaining PMAs.  */
  assert( pSorter->pReader==0 );
  if( rc==SQLITE_OK ){
    rc = vdbeSorterSetupMerge(pSorter);
    *pbEof = 0;
  }

  vdbeSorterRewindDebug("rewinddone");
  return rc;
}